

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::WeightParams::SerializeWithCachedSizes
          (WeightParams *this,CodedOutputStream *output)

{
  Rep *pRVar1;
  string *psVar2;
  float *a;
  
  if (0 < (this->floatvalue_).current_size_) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,10);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_floatvalue_cached_byte_size_);
    pRVar1 = (this->floatvalue_).rep_;
    a = pRVar1->elements;
    if (pRVar1 == (Rep *)0x0) {
      a = (float *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteFloatArray
              (a,(this->floatvalue_).current_size_,output);
  }
  psVar2 = (this->float16value_).ptr_;
  if (psVar2->_M_string_length != 0) {
    google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(2,psVar2,output);
  }
  psVar2 = (this->rawvalue_).ptr_;
  if (psVar2->_M_string_length != 0) {
    google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(0x1e,psVar2,output);
  }
  psVar2 = (this->int8rawvalue_).ptr_;
  if (psVar2->_M_string_length != 0) {
    google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(0x1f,psVar2,output);
  }
  if (this->quantization_ != (QuantizationParams *)0x0 &&
      this != (WeightParams *)&_WeightParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x28,&this->quantization_->super_MessageLite,output);
  }
  if (this->isupdatable_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x32,true,output);
    return;
  }
  return;
}

Assistant:

void WeightParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.WeightParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated float floatValue = 1;
  if (this->floatvalue_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_floatvalue_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteFloatArray(
      this->floatvalue().data(), this->floatvalue_size(), output);
  }

  // bytes float16Value = 2;
  if (this->float16value().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(
      2, this->float16value(), output);
  }

  // bytes rawValue = 30;
  if (this->rawvalue().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(
      30, this->rawvalue(), output);
  }

  // bytes int8RawValue = 31;
  if (this->int8rawvalue().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(
      31, this->int8rawvalue(), output);
  }

  // .CoreML.Specification.QuantizationParams quantization = 40;
  if (this->has_quantization()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      40, *this->quantization_, output);
  }

  // bool isUpdatable = 50;
  if (this->isupdatable() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(50, this->isupdatable(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.WeightParams)
}